

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_samtools.c
# Opt level: O1

bam_hdr_t * cram_header_to_bam(SAM_hdr *h)

{
  int iVar1;
  ulong uVar2;
  bam_hdr_t *pbVar3;
  char *pcVar4;
  char **ppcVar5;
  uint32_t *puVar6;
  long lVar7;
  uint32_t uVar8;
  long lVar9;
  
  pbVar3 = bam_hdr_init();
  uVar2 = (h->text).l;
  uVar8 = (uint32_t)uVar2;
  pbVar3->l_text = uVar8;
  pcVar4 = (char *)malloc((ulong)(uVar8 + 1));
  pbVar3->text = pcVar4;
  memcpy(pcVar4,(h->text).s,uVar2 & 0xffffffff);
  pbVar3->text[pbVar3->l_text] = '\0';
  iVar1 = h->nref;
  pbVar3->n_targets = iVar1;
  ppcVar5 = (char **)calloc((long)iVar1,8);
  pbVar3->target_name = ppcVar5;
  puVar6 = (uint32_t *)calloc((long)iVar1,4);
  pbVar3->target_len = puVar6;
  if (0 < h->nref) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      pcVar4 = strdup((&h->ref->name)[lVar9]);
      *(char **)((long)pbVar3->target_name + lVar9 * 2) = pcVar4;
      *(uint32_t *)((long)pbVar3->target_len + lVar9) = (&h->ref->len)[lVar9 * 2];
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 4;
    } while (lVar7 < h->nref);
  }
  return pbVar3;
}

Assistant:

bam_hdr_t *cram_header_to_bam(SAM_hdr *h) {
    int i;
    bam_hdr_t *header = bam_hdr_init();

    header->l_text = ks_len(&h->text);
    header->text = malloc(header->l_text+1);
    memcpy(header->text, ks_str(&h->text), header->l_text);
    header->text[header->l_text] = 0;

    header->n_targets = h->nref;
    header->target_name = (char **)calloc(header->n_targets,
					  sizeof(char *));
    header->target_len = (uint32_t *)calloc(header->n_targets, 4);

    for (i = 0; i < h->nref; i++) {
	header->target_name[i] = strdup(h->ref[i].name);
	header->target_len[i] = h->ref[i].len;
    }

    return header;
}